

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread_pool.h
# Opt level: O1

future<void> __thiscall
ThreadPool::
enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long)>>
          (ThreadPool *this,
          _Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long)>
          *f)

{
  runtime_error *this_00;
  undefined8 *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  future<void> fVar2;
  shared_ptr<std::packaged_task<void_()>_> task;
  unique_lock<std::mutex> lock;
  packaged_task<void_()> *local_78;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_70;
  anon_class_16_1_8991e283 local_68;
  _Bind<std::_Bind<void_(*(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long))(const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long)>_()>
  local_50;
  
  local_50._M_f._M_f =
       (_func_void_vector<float,_std::allocator<float>_>_ptr_vector<float,_std::allocator<float>_>_ptr_Info_ptr_unsigned_long_unsigned_long
        *)*in_RDX;
  local_50._M_f._M_bound_args.
  super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
  .
  super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
  .super__Tuple_impl<2UL,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<4UL,_unsigned_long>.
  super__Head_base<4UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<4UL,_unsigned_long,_false>)in_RDX[1];
  local_50._M_f._M_bound_args.
  super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
  .
  super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
  .super__Tuple_impl<2UL,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.super__Head_base<3UL,_unsigned_long,_false>.
  _M_head_impl = in_RDX[2];
  local_50._M_f._M_bound_args.
  super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
  .
  super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
  .super__Tuple_impl<2UL,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>.
  super__Head_base<2UL,_xLearn::AUCMetric::Info_*,_false>._M_head_impl = (Info *)in_RDX[3];
  local_50._M_f._M_bound_args.
  super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
  .
  super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
  .super__Head_base<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_false>._M_head_impl =
       (vector<float,_std::allocator<float>_> *)in_RDX[4];
  local_50._M_f._M_bound_args.
  super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
  .super__Head_base<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_false>._M_head_impl =
       (vector<float,_std::allocator<float>_> *)in_RDX[5];
  local_78 = (packaged_task<void_()> *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<std::packaged_task<void()>,std::allocator<std::packaged_task<void()>>,std::_Bind<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long)>()>>
            (&_Stack_70,&local_78,(allocator<std::packaged_task<void_()>_> *)&local_68,&local_50);
  std::packaged_task<void_()>::get_future((packaged_task<void_()> *)this);
  local_50._M_f._M_f =
       (_func_void_vector<float,_std::allocator<float>_>_ptr_vector<float,_std::allocator<float>_>_ptr_Info_ptr_unsigned_long_unsigned_long
        *)&f[2]._M_bound_args;
  local_50._M_f._M_bound_args.
  super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
  .
  super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
  .super__Tuple_impl<2UL,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<4UL,_unsigned_long>.
  super__Head_base<4UL,_unsigned_long,_false>._M_head_impl =
       (_Head_base<4UL,_unsigned_long,_false>)
       ((ulong)local_50._M_f._M_bound_args.
               super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
               .
               super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
               .super__Tuple_impl<2UL,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>.
               super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.
               super__Tuple_impl<4UL,_unsigned_long>.super__Head_base<4UL,_unsigned_long,_false>.
               _M_head_impl & 0xffffffffffffff00);
  std::unique_lock<std::mutex>::lock((unique_lock<std::mutex> *)&local_50);
  local_50._M_f._M_bound_args.
  super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
  .
  super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
  .super__Tuple_impl<2UL,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>.
  super__Tuple_impl<3UL,_unsigned_long,_unsigned_long>.super__Tuple_impl<4UL,_unsigned_long>.
  super__Head_base<4UL,_unsigned_long,_false>._M_head_impl._0_1_ = 1;
  if (*(char *)&f[5]._M_bound_args.
                super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
                .super__Head_base<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_false>.
                _M_head_impl != '\x01') {
    local_68.task.super___shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>._M_ptr
         = local_78;
    local_68.task.super___shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = _Stack_70._M_pi;
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_70._M_pi)->_M_use_count = (_Stack_70._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_70._M_pi)->_M_use_count = (_Stack_70._M_pi)->_M_use_count + 1;
      }
    }
    std::deque<std::function<void()>,std::allocator<std::function<void()>>>::
    emplace_back<ThreadPool::enqueue<std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long)>>(std::_Bind<void(*(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long))(std::vector<float,std::allocator<float>>const*,std::vector<float,std::allocator<float>>const*,xLearn::AUCMetric::Info*,unsigned_long,unsigned_long)>&&)::_lambda()_1_>
              ((deque<std::function<void()>,std::allocator<std::function<void()>>> *)
               &(f->_M_bound_args).
                super__Tuple_impl<0UL,_const_std::vector<float,_std::allocator<float>_>_*,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
                .
                super__Tuple_impl<1UL,_const_std::vector<float,_std::allocator<float>_>_*,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>
                .super__Tuple_impl<2UL,_xLearn::AUCMetric::Info_*,_unsigned_long,_unsigned_long>.
                super__Head_base<2UL,_xLearn::AUCMetric::Info_*,_false>,&local_68);
    if (local_68.task.super___shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_68.task.
                 super___shared_ptr<std::packaged_task<void_()>,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
    }
    std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&local_50);
    std::condition_variable::notify_one();
    _Var1._M_pi = extraout_RDX;
    if (_Stack_70._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_70._M_pi);
      _Var1._M_pi = extraout_RDX_00;
    }
    fVar2.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi = _Var1._M_pi;
    fVar2.super___basic_future<void>._M_state.
    super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)this;
    return (future<void>)
           fVar2.super___basic_future<void>._M_state.
           super___shared_ptr<std::__future_base::_State_baseV2,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"enqueue on stopped ThreadPool");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

auto ThreadPool::enqueue(F&& f, Args&&... args)
    -> std::future<typename std::result_of<F(Args...)>::type> {
  using return_type = typename std::result_of<F(Args...)>::type;
  auto task = std::make_shared< std::packaged_task<return_type()> >(
    std::bind(std::forward<F>(f), std::forward<Args>(args)...)
  );
  std::future<return_type> res = task->get_future();
  {
    std::unique_lock<std::mutex> lock(queue_mutex);
    // don't allow enqueueing after stopping the pool
    if (stop) {
      throw std::runtime_error("enqueue on stopped ThreadPool");
    }
    tasks.emplace([task](){ (*task)(); });
  }
  condition.notify_one();
  return res;
}